

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall
QDateTimeEdit::setCalendarWidget(QDateTimeEdit *this,QCalendarWidget *calendarWidget)

{
  bool bVar1;
  QDateTimeEditPrivate *function;
  QFlags<QDateTimeParser::Section> *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  QDateTimeEditPrivate *d;
  int iVar2;
  QMessageLogger *in_stack_ffffffffffffff90;
  QCalendarWidget *in_stack_ffffffffffffffa0;
  QDateTimeEditPrivate *in_stack_ffffffffffffffa8;
  QFlagsStorageHelper<QDateTimeParser::Section,_4> local_4c;
  char local_48 [32];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  function = d_func((QDateTimeEdit *)0x55a260);
  iVar2 = (int)((ulong)in_RSI >> 0x20);
  if (in_RSI == (QFlags<QDateTimeParser::Section> *)0x0) {
    QMessageLogger::QMessageLogger(in_stack_ffffffffffffff90,in_RDI,iVar2,(char *)function);
    QMessageLogger::warning
              (local_28,"QDateTimeEdit::setCalendarWidget: Cannot set a null calendar widget");
  }
  else if (((function->calendarPopup ^ 0xffU) & 1) == 0) {
    local_4c.super_QFlagsStorage<QDateTimeParser::Section>.i =
         (QFlagsStorage<QDateTimeParser::Section>)
         QFlags<QDateTimeParser::Section>::operator&(in_RSI,(Section)((ulong)function >> 0x20));
    iVar2 = (int)((ulong)in_RSI >> 0x20);
    bVar1 = QFlags<QDateTimeParser::Section>::operator!
                      ((QFlags<QDateTimeParser::Section> *)&local_4c);
    if (bVar1) {
      QMessageLogger::QMessageLogger(in_stack_ffffffffffffff90,in_RDI,iVar2,(char *)function);
      QMessageLogger::warning
                (&stack0xffffffffffffff90,
                 "QDateTimeEdit::setCalendarWidget: no date sections specified");
    }
    else {
      QDateTimeEditPrivate::initCalendarPopup(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    }
  }
  else {
    QMessageLogger::QMessageLogger(in_stack_ffffffffffffff90,in_RDI,iVar2,(char *)function);
    QMessageLogger::warning
              (local_48,"QDateTimeEdit::setCalendarWidget: calendarPopup is set to false");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setCalendarWidget(QCalendarWidget *calendarWidget)
{
    Q_D(QDateTimeEdit);
    if (Q_UNLIKELY(!calendarWidget)) {
        qWarning("QDateTimeEdit::setCalendarWidget: Cannot set a null calendar widget");
        return;
    }

    if (Q_UNLIKELY(!d->calendarPopup)) {
        qWarning("QDateTimeEdit::setCalendarWidget: calendarPopup is set to false");
        return;
    }

    if (Q_UNLIKELY(!(d->display & QDateTimeParser::DateSectionMask))) {
        qWarning("QDateTimeEdit::setCalendarWidget: no date sections specified");
        return;
    }
    d->initCalendarPopup(calendarWidget);
}